

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScrollerPrivate::setContentPositionHelperScrolling(QScrollerPrivate *this)

{
  bool bVar1;
  QScrollerPrivate *p;
  QDebug *pQVar2;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  qint64 now;
  QPointF newClampedPos;
  QPointF newPos;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QScrollEvent se;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *cat;
  QPointF *in_stack_fffffffffffffeb0;
  QScrollerPrivate *this_00;
  QRectF *rect;
  QPointF *oldPos;
  qint64 in_stack_fffffffffffffee0;
  QQueue<QScrollerPrivate::ScrollSegment> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef8;
  QDebug local_100;
  QDebug local_f8;
  QDebug local_f0;
  QDebug local_e8;
  QDebug local_e0;
  QPointF local_d8;
  QPointF local_c8;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  QPointF local_70;
  undefined1 *local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  QScrollEvent local_50 [56];
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  oldPos = in_RDI;
  p = (QScrollerPrivate *)QElapsedTimer::elapsed();
  local_70.yp = -NAN;
  local_70.xp = -NAN;
  local_70 = ::operator+(in_RDI,in_stack_fffffffffffffeb0);
  cat = (QLoggingCategory *)&in_RDI[0xe].yp;
  this_00 = p;
  QPointF::x(&local_70);
  qVar3 = nextSegmentPosition(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(qreal)oldPos);
  QPointF::setX(&local_70,qVar3);
  rect = (QRectF *)(in_RDI + 0x10);
  QPointF::y(&local_70);
  qVar3 = nextSegmentPosition(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(qreal)oldPos);
  QPointF::setY(&local_70,qVar3);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,cat);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa8379b);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)rect,(char *)in_RDI,(int)((ulong)this_00 >> 0x20),(char *)cat,
               (char *)0xa837b4);
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)p,in_stack_fffffffffffffef8);
    QDebug::QDebug(&local_90,pQVar2);
    ::operator<<((QDebug *)&local_88,(QPointF *)&local_90);
    pQVar2 = QDebug::operator<<((QDebug *)p,in_stack_fffffffffffffef8);
    QDebug::QDebug(&local_80,pQVar2);
    ::operator<<((QDebug *)&local_78,(QPointF *)&local_80);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug(&local_98);
    local_10 = 0;
  }
  local_c8.yp = -NAN;
  local_c8.xp = -NAN;
  local_c8 = clampToRect((QPointF *)p,rect);
  local_d8 = ::operator-(in_RDI,(QPointF *)this_00);
  in_RDI[7].yp = local_d8.xp;
  in_RDI[8].xp = local_d8.yp;
  in_RDI[6].yp = local_c8.xp;
  in_RDI[7].xp = local_c8.yp;
  memcpy(local_50,&DAT_00b4bfd0,0x38);
  QScrollEvent::QScrollEvent
            (local_50,(QPointF *)&in_RDI[6].yp,(QPointF *)&in_RDI[7].yp,
             (uint)(((ulong)in_RDI[9].xp & 1) == 0));
  sendEvent(this_00,(QObject *)cat,(QEvent *)0xa839a3);
  *(undefined1 *)&in_RDI[9].xp = 0;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaa;
  uStack_57 = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,cat);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_60), bVar1) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa83a05);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)rect,(char *)in_RDI,(int)((ulong)this_00 >> 0x20),(char *)cat,
               (char *)0xa83a1b);
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)p,in_stack_fffffffffffffef8);
    QDebug::QDebug(&local_f8,pQVar2);
    ::operator<<((QDebug *)&local_f0,(QPointF *)&local_f8);
    pQVar2 = QDebug::operator<<((QDebug *)p,in_stack_fffffffffffffef8);
    QDebug::QDebug(&local_e8,pQVar2);
    ::operator<<((QDebug *)&local_e0,(QPointF *)&local_e8);
    QDebug::~QDebug(&local_e0);
    QDebug::~QDebug(&local_e8);
    QDebug::~QDebug(&local_f0);
    QDebug::~QDebug(&local_f8);
    QDebug::~QDebug(&local_100);
    local_58 = 0;
  }
  QScrollEvent::~QScrollEvent(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::setContentPositionHelperScrolling()
{
    qint64 now = monotonicTimer.elapsed();
    QPointF newPos = contentPosition + overshootPosition;

    newPos.setX(nextSegmentPosition(xSegments, now, newPos.x()));
    newPos.setY(nextSegmentPosition(ySegments, now, newPos.y()));

    // -- set the position and handle overshoot
    qCDebug(lcScroller) << "QScroller::setContentPositionHelperScrolling()\n"
                        "  --> overshoot:" << overshootPosition << "- new pos:" << newPos;

    QPointF newClampedPos = clampToRect(newPos, contentPosRange);

    overshootPosition = newPos - newClampedPos;
    contentPosition = newClampedPos;

    QScrollEvent se(contentPosition, overshootPosition, firstScroll ? QScrollEvent::ScrollStarted
                                                                    : QScrollEvent::ScrollUpdated);
    sendEvent(target, &se);
    firstScroll = false;

    qCDebug(lcScroller) << "  --> new position:" << newClampedPos << "- new overshoot:" << overshootPosition;
}